

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O3

ENUM__morph_method_enum
COLLADASaxFWL15::toEnum_ENUM__morph_method_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__morph_method_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  if (enumMap->first != SVar1) {
    if (enumMap[1].first != SVar1) {
      *failed = true;
      return ENUM__morph_method_enum__COUNT;
    }
    enumMap = enumMap + 1;
  }
  *failed = false;
  return enumMap->second;
}

Assistant:

ENUM__morph_method_enum toEnum_ENUM__morph_method_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__morph_method_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__morph_method_enum, StringHash, ENUM__morph_method_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}